

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void av1_fwd_txfm2d_8x16_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  longlong *plVar1;
  undefined4 *puVar2;
  code *pcVar3;
  code *pcVar4;
  int8_t *piVar5;
  ulong uVar6;
  undefined7 in_register_00000009;
  ulong uVar7;
  uint uVar8;
  __m128i *palVar9;
  long lVar10;
  int iVar11;
  __m128i out [32];
  __m128i in [32];
  
  piVar5 = av1_fwd_txfm_shift_ls[7];
  iVar11 = (int)CONCAT71(in_register_00000009,tx_type);
  uVar8 = iVar11 - 4;
  uVar6 = (ulong)(uint)(iVar11 << 3);
  pcVar3 = *(code **)((long)col_highbd_txfm8x16_arr + uVar6);
  iVar11 = 0;
  uVar7 = 0;
  if ((byte)uVar8 < 0xc) {
    uVar8 = (uVar8 & 0xff) << 2;
    iVar11 = *(int *)(&DAT_004bc89c + uVar8);
    uVar7 = (ulong)*(uint *)(&DAT_004bc8cc + uVar8);
  }
  pcVar4 = *(code **)((long)row_highbd_txfm8x8_arr + uVar6);
  load_buffer_8x16(input,in,stride,iVar11,(int)uVar7,(int)*av1_fwd_txfm_shift_ls[7]);
  (*pcVar3)(in,in,0xd,2);
  iVar11 = -(int)piVar5[1];
  col_txfm_8x8_rounding(in,iVar11);
  col_txfm_8x8_rounding(in + 0x10,iVar11);
  transpose_8x8(in,out);
  transpose_8x8(in + 0x10,out + 0x10);
  palVar9 = out;
  for (lVar10 = -0x40; lVar10 != 0; lVar10 = lVar10 + 0x20) {
    (*pcVar4)(palVar9,out,0xd,2);
    av1_round_shift_rect_array_32_sse4_1(out,out,0x10,-(int)piVar5[2],(int)uVar7);
    plVar1 = (longlong *)((long)coeff + lVar10 + 0x40);
    *plVar1 = out[0][0];
    plVar1[1] = out[0][1];
    plVar1 = (longlong *)((long)coeff + lVar10 + 0x50);
    *plVar1 = out[1][0];
    plVar1[1] = out[1][1];
    plVar1 = (longlong *)((long)coeff + lVar10 + 0x80);
    *plVar1 = out[2][0];
    plVar1[1] = out[2][1];
    plVar1 = (longlong *)((long)coeff + lVar10 + 0x90);
    *plVar1 = out[3][0];
    plVar1[1] = out[3][1];
    plVar1 = (longlong *)((long)coeff + lVar10 + 0xc0);
    *plVar1 = out[4][0];
    plVar1[1] = out[4][1];
    plVar1 = (longlong *)((long)coeff + lVar10 + 0xd0);
    *plVar1 = out[5][0];
    plVar1[1] = out[5][1];
    plVar1 = (longlong *)((long)coeff + lVar10 + 0x100);
    *plVar1 = out[6][0];
    plVar1[1] = out[6][1];
    plVar1 = (longlong *)((long)coeff + lVar10 + 0x110);
    *plVar1 = out[7][0];
    plVar1[1] = out[7][1];
    plVar1 = (longlong *)((long)coeff + lVar10 + 0x140);
    *plVar1 = out[8][0];
    plVar1[1] = out[8][1];
    plVar1 = (longlong *)((long)coeff + lVar10 + 0x150);
    *plVar1 = out[9][0];
    plVar1[1] = out[9][1];
    plVar1 = (longlong *)((long)coeff + lVar10 + 0x180);
    *plVar1 = out[10][0];
    plVar1[1] = out[10][1];
    plVar1 = (longlong *)((long)coeff + lVar10 + 400);
    *plVar1 = out[0xb][0];
    plVar1[1] = out[0xb][1];
    plVar1 = (longlong *)((long)coeff + lVar10 + 0x1c0);
    *plVar1 = out[0xc][0];
    plVar1[1] = out[0xc][1];
    plVar1 = (longlong *)((long)coeff + lVar10 + 0x1d0);
    *plVar1 = out[0xd][0];
    plVar1[1] = out[0xd][1];
    plVar1 = (longlong *)((long)coeff + lVar10 + 0x200);
    *plVar1 = out[0xe][0];
    plVar1[1] = out[0xe][1];
    puVar2 = (undefined4 *)((long)coeff + lVar10 + 0x210);
    *puVar2 = (undefined4)out[0xf][0];
    puVar2[1] = out[0xf][0]._4_4_;
    puVar2[2] = (undefined4)out[0xf][1];
    puVar2[3] = out[0xf][1]._4_4_;
    palVar9 = palVar9 + 0x10;
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_8x16_sse4_1(const int16_t *input, int32_t *coeff,
                                int stride, TX_TYPE tx_type, int bd) {
  __m128i in[32], out[32];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_8X16];
  const int txw_idx = get_txw_idx(TX_8X16);
  const int txh_idx = get_txh_idx(TX_8X16);
  const fwd_transform_1d_sse4_1 col_txfm = col_highbd_txfm8x16_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = row_highbd_txfm8x8_arr[tx_type];
  int bit = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);

  load_buffer_8x16(input, in, stride, ud_flip, lr_flip, shift[0]);
  col_txfm(in, in, bit, 2);
  col_txfm_8x16_rounding(in, -shift[1]);
  transpose_8x8(in, out);
  transpose_8x8(in + 16, out + 16);

  for (int i = 0; i < 2; i++) {
    row_txfm(out + i * 16, out, bit, 2);
    av1_round_shift_rect_array_32_sse4_1(out, out, 16, -shift[2], NewSqrt2);
    write_buffer_16x8(out, coeff + i * 8, 16);
  }
  (void)bd;
}